

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftzopen.c
# Opt level: O0

FT_ULong ft_lzwstate_io(FT_LzwState state,FT_Byte *buffer,FT_ULong out_size)

{
  undefined1 uVar1;
  FT_LzwPhase FVar2;
  uint uVar3;
  FT_Error FVar4;
  FT_UInt FVar5;
  int iVar6;
  FT_ULong FVar7;
  int local_4c;
  FT_UInt local_44;
  FT_UInt code;
  FT_Int32 c_1;
  FT_Int32 c;
  FT_UInt FStack_30;
  FT_Byte max_bits;
  FT_UInt in_code;
  FT_UInt old_code;
  FT_UInt old_char;
  FT_ULong result;
  FT_ULong out_size_local;
  FT_Byte *buffer_local;
  FT_LzwState state_local;
  
  _old_code = 0;
  in_code = state->old_char;
  FStack_30 = state->old_code;
  c = state->in_code;
  buffer_local = (FT_Byte *)state;
  if (out_size == 0) goto LAB_001d4a6f;
  FVar2 = state->phase;
  result = out_size;
  out_size_local = (FT_ULong)buffer;
  if (FVar2 == FT_LZW_PHASE_START) {
    FVar4 = FT_Stream_Seek(state->source,2);
    if ((FVar4 == 0) &&
       (FVar7 = FT_Stream_TryRead(*(FT_Stream *)(buffer_local + 200),(FT_Byte *)((long)&c_1 + 3),1),
       FVar7 == 1)) {
      *(uint *)(buffer_local + 0x30) = c_1._3_1_ & 0x1f;
      *(uint *)(buffer_local + 0x34) = c_1._3_1_ & 0x80;
      *(int *)(buffer_local + 0x38) =
           (int)(1L << ((byte)*(undefined4 *)(buffer_local + 0x30) & 0x3f)) + -0x100;
      if (*(uint *)(buffer_local + 0x30) < 0x11) {
        buffer_local[0x3c] = '\t';
        buffer_local[0x3d] = '\0';
        buffer_local[0x3e] = '\0';
        buffer_local[0x3f] = '\0';
        iVar6 = 0x100;
        if (*(int *)(buffer_local + 0x34) != 0) {
          iVar6 = 0x101;
        }
        *(int *)(buffer_local + 0x40) = iVar6 + -0x100;
        c = 0;
        if (*(uint *)(buffer_local + 0x3c) < *(uint *)(buffer_local + 0x30)) {
          local_4c = (int)(1L << ((byte)*(undefined4 *)(buffer_local + 0x3c) & 0x3f)) + -0x100;
        }
        else {
          local_4c = *(int *)(buffer_local + 0x38) + 1;
        }
        *(int *)(buffer_local + 0x44) = local_4c;
        FVar5 = ft_lzwstate_get_code((FT_LzwState)buffer_local);
        if ((-1 < (int)FVar5) && ((int)FVar5 < 0x100)) {
          if (out_size_local != 0) {
            *(char *)(out_size_local + _old_code) = (char)FVar5;
          }
          _old_code = _old_code + 1;
          FStack_30 = FVar5;
          in_code = FVar5;
          if (result <= _old_code) goto LAB_001d4a6f;
          buffer_local[0] = '\x01';
          buffer_local[1] = '\0';
          buffer_local[2] = '\0';
          buffer_local[3] = '\0';
          goto LAB_001d47bc;
        }
      }
    }
  }
  else {
    if (FVar2 != FT_LZW_PHASE_CODE) {
      if (FVar2 == FT_LZW_PHASE_STACK) goto LAB_001d498e;
      goto LAB_001d4a6f;
    }
LAB_001d47bc:
    while (local_44 = ft_lzwstate_get_code((FT_LzwState)buffer_local), -1 < (int)local_44) {
      if ((local_44 == 0x100) && (*(int *)(buffer_local + 0x34) != 0)) {
        buffer_local[0x40] = '\0';
        buffer_local[0x41] = '\0';
        buffer_local[0x42] = '\0';
        buffer_local[0x43] = '\0';
        buffer_local[0x20] = '\x01';
        FStack_30 = 0;
        in_code = 0;
      }
      else {
        c = local_44;
        if (0xff < local_44) {
          if (*(uint *)(buffer_local + 0x40) <= local_44 - 0x100) {
            if ((*(uint *)(buffer_local + 0x40) < local_44 - 0x100) ||
               ((*(ulong *)(buffer_local + 0x80) <= (ulong)*(uint *)(buffer_local + 0x78) &&
                (iVar6 = ft_lzwstate_stack_grow((FT_LzwState)buffer_local), iVar6 < 0)))) break;
            uVar3 = *(uint *)(buffer_local + 0x78);
            *(uint *)(buffer_local + 0x78) = uVar3 + 1;
            *(char *)(*(long *)(buffer_local + 0x70) + (ulong)uVar3) = (char)in_code;
            local_44 = FStack_30;
          }
          for (; 0xff < local_44;
              local_44 = (FT_UInt)*(ushort *)
                                   (*(long *)(buffer_local + 0x58) + (ulong)(local_44 - 0x100) * 2))
          {
            if ((*(long *)(buffer_local + 0x58) == 0) ||
               ((*(ulong *)(buffer_local + 0x80) <= (ulong)*(uint *)(buffer_local + 0x78) &&
                (iVar6 = ft_lzwstate_stack_grow((FT_LzwState)buffer_local), iVar6 < 0))))
            goto LAB_001d4a97;
            uVar1 = *(undefined1 *)(*(long *)(buffer_local + 0x60) + (ulong)(local_44 - 0x100));
            uVar3 = *(uint *)(buffer_local + 0x78);
            *(uint *)(buffer_local + 0x78) = uVar3 + 1;
            *(undefined1 *)(*(long *)(buffer_local + 0x70) + (ulong)uVar3) = uVar1;
          }
        }
        in_code = local_44;
        if ((*(ulong *)(buffer_local + 0x80) <= (ulong)*(uint *)(buffer_local + 0x78)) &&
           (iVar6 = ft_lzwstate_stack_grow((FT_LzwState)buffer_local), iVar6 < 0)) break;
        uVar3 = *(uint *)(buffer_local + 0x78);
        *(uint *)(buffer_local + 0x78) = uVar3 + 1;
        *(char *)(*(long *)(buffer_local + 0x70) + (ulong)uVar3) = (char)in_code;
        buffer_local[0] = '\x02';
        buffer_local[1] = '\0';
        buffer_local[2] = '\0';
        buffer_local[3] = '\0';
LAB_001d498e:
        while (*(int *)(buffer_local + 0x78) != 0) {
          *(int *)(buffer_local + 0x78) = *(int *)(buffer_local + 0x78) + -1;
          if (out_size_local != 0) {
            *(undefined1 *)(out_size_local + _old_code) =
                 *(undefined1 *)
                  (*(long *)(buffer_local + 0x70) + (ulong)*(uint *)(buffer_local + 0x78));
          }
          _old_code = _old_code + 1;
          if (_old_code == result) goto LAB_001d4a6f;
        }
        if (*(uint *)(buffer_local + 0x40) < *(uint *)(buffer_local + 0x38)) {
          if ((*(uint *)(buffer_local + 0x68) <= *(uint *)(buffer_local + 0x40)) &&
             (iVar6 = ft_lzwstate_prefix_grow((FT_LzwState)buffer_local), iVar6 < 0)) break;
          *(short *)(*(long *)(buffer_local + 0x58) + (ulong)*(uint *)(buffer_local + 0x40) * 2) =
               (short)FStack_30;
          *(char *)(*(long *)(buffer_local + 0x60) + (ulong)*(uint *)(buffer_local + 0x40)) =
               (char)in_code;
          *(int *)(buffer_local + 0x40) = *(int *)(buffer_local + 0x40) + 1;
        }
        buffer_local[0] = '\x01';
        buffer_local[1] = '\0';
        buffer_local[2] = '\0';
        buffer_local[3] = '\0';
        FStack_30 = c;
      }
    }
  }
LAB_001d4a97:
  buffer_local[0] = '\x03';
  buffer_local[1] = '\0';
  buffer_local[2] = '\0';
  buffer_local[3] = '\0';
LAB_001d4a6f:
  *(FT_UInt *)(buffer_local + 0x48) = FStack_30;
  *(FT_UInt *)(buffer_local + 0x4c) = in_code;
  *(FT_Int32 *)(buffer_local + 0x50) = c;
  return _old_code;
}

Assistant:

FT_LOCAL_DEF( FT_ULong )
  ft_lzwstate_io( FT_LzwState  state,
                  FT_Byte*     buffer,
                  FT_ULong     out_size )
  {
    FT_ULong  result = 0;

    FT_UInt  old_char = state->old_char;
    FT_UInt  old_code = state->old_code;
    FT_UInt  in_code  = state->in_code;


    if ( out_size == 0 )
      goto Exit;

    switch ( state->phase )
    {
    case FT_LZW_PHASE_START:
      {
        FT_Byte   max_bits;
        FT_Int32  c;


        /* skip magic bytes, and read max_bits + block_flag */
        if ( FT_Stream_Seek( state->source, 2 ) != 0               ||
             FT_Stream_TryRead( state->source, &max_bits, 1 ) != 1 )
          goto Eof;

        state->max_bits   = max_bits & LZW_BIT_MASK;
        state->block_mode = max_bits & LZW_BLOCK_MASK;
        state->max_free   = (FT_UInt)( ( 1UL << state->max_bits ) - 256 );

        if ( state->max_bits > LZW_MAX_BITS )
          goto Eof;

        state->num_bits = LZW_INIT_BITS;
        state->free_ent = ( state->block_mode ? LZW_FIRST
                                              : LZW_CLEAR ) - 256;
        in_code  = 0;

        state->free_bits = state->num_bits < state->max_bits
                           ? (FT_UInt)( ( 1UL << state->num_bits ) - 256 )
                           : state->max_free + 1;

        c = ft_lzwstate_get_code( state );
        if ( c < 0 || c > 255 )
          goto Eof;

        old_code = old_char = (FT_UInt)c;

        if ( buffer )
          buffer[result] = (FT_Byte)old_char;

        if ( ++result >= out_size )
          goto Exit;

        state->phase = FT_LZW_PHASE_CODE;
      }
      /* fall-through */

    case FT_LZW_PHASE_CODE:
      {
        FT_Int32  c;
        FT_UInt   code;


      NextCode:
        c = ft_lzwstate_get_code( state );
        if ( c < 0 )
          goto Eof;

        code = (FT_UInt)c;

        if ( code == LZW_CLEAR && state->block_mode )
        {
          /* why not LZW_FIRST-256 ? */
          state->free_ent  = ( LZW_FIRST - 1 ) - 256;
          state->buf_clear = 1;

          /* not quite right, but at least more predictable */
          old_code = 0;
          old_char = 0;

          goto NextCode;
        }

        in_code = code; /* save code for later */

        if ( code >= 256U )
        {
          /* special case for KwKwKwK */
          if ( code - 256U >= state->free_ent )
          {
            /* corrupted LZW stream */
            if ( code - 256U > state->free_ent )
              goto Eof;

            FTLZW_STACK_PUSH( old_char );
            code = old_code;
          }

          while ( code >= 256U )
          {
            if ( !state->prefix )
              goto Eof;

            FTLZW_STACK_PUSH( state->suffix[code - 256] );
            code = state->prefix[code - 256];
          }
        }

        old_char = code;
        FTLZW_STACK_PUSH( old_char );

        state->phase = FT_LZW_PHASE_STACK;
      }
      /* fall-through */

    case FT_LZW_PHASE_STACK:
      {
        while ( state->stack_top > 0 )
        {
          state->stack_top--;

          if ( buffer )
            buffer[result] = state->stack[state->stack_top];

          if ( ++result == out_size )
            goto Exit;
        }

        /* now create new entry */
        if ( state->free_ent < state->max_free )
        {
          if ( state->free_ent >= state->prefix_size &&
               ft_lzwstate_prefix_grow( state ) < 0  )
            goto Eof;

          FT_ASSERT( state->free_ent < state->prefix_size );

          state->prefix[state->free_ent] = (FT_UShort)old_code;
          state->suffix[state->free_ent] = (FT_Byte)  old_char;

          state->free_ent += 1;
        }

        old_code = in_code;

        state->phase = FT_LZW_PHASE_CODE;
        goto NextCode;
      }

    default:  /* state == EOF */
      ;
    }

  Exit:
    state->old_code = old_code;
    state->old_char = old_char;
    state->in_code  = in_code;

    return result;

  Eof:
    state->phase = FT_LZW_PHASE_EOF;
    goto Exit;
  }